

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_contains_range(void **param_1)

{
  roaring64_bitmap_t *r_13;
  roaring64_bitmap_t *expression;
  roaring64_bitmap_t *file;
  roaring64_bitmap_t *r_12;
  roaring64_bitmap_t *r_11;
  roaring64_bitmap_t *r_10;
  roaring64_bitmap_t *r_9;
  roaring64_bitmap_t *r_8;
  roaring64_bitmap_t *r_7;
  roaring64_bitmap_t *r_6;
  roaring64_bitmap_t *r_5;
  roaring64_bitmap_t *r_4;
  roaring64_bitmap_t *r_3;
  roaring64_bitmap_t *r_2;
  roaring64_bitmap_t *r_1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000078;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  roaring64_bitmap_t *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  roaring64_bitmap_t *in_stack_ffffffffffffffa0;
  
  roaring64_bitmap_create();
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103d10);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103d69);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103df9);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103ef0);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103f80);
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103f94);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x103ff1);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add(in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add(in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  roaring64_bitmap_create();
  roaring64_bitmap_add(in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  r_13 = roaring64_bitmap_create();
  roaring64_bitmap_add(r_13,(uint64_t)in_stack_ffffffffffffff98);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  expression = roaring64_bitmap_create();
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
  roaring64_bitmap_add_range
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             ,0x10421c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  file = roaring64_bitmap_create();
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)file,in_stack_ffffffffffffff8c);
  roaring64_bitmap_add(r_13,(uint64_t)expression);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)file,in_stack_ffffffffffffff8c);
  roaring64_bitmap_add(r_13,(uint64_t)expression);
  roaring64_bitmap_contains_range(in_stack_00000078,(uint64_t)param_1,(uint64_t)r);
  _assert_true((unsigned_long)r_13,(char *)expression,(char *)file,in_stack_ffffffffffffff8c);
  roaring64_bitmap_free((roaring64_bitmap_t *)r_9);
  return;
}

Assistant:

DEFINE_TEST(test_contains_range) {
    {
        // Empty bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(roaring64_bitmap_contains_range(r, 1, 10));
        roaring64_bitmap_free(r);
    }
    {
        // Empty range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range within one container.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, 10));
        assert_false(roaring64_bitmap_contains_range(r, 1, 11));
        roaring64_bitmap_free(r);
    }
    {
        // Range across two containers.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (1 << 16) + 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 10));
        assert_true(roaring64_bitmap_contains_range(r, 1, (1 << 16) - 1));
        assert_false(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 11));
        assert_false(roaring64_bitmap_contains_range(r, 0, (1 << 16) + 10));
        roaring64_bitmap_free(r);
    }
    {
        // Range across three containers.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (2 << 16) + 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, (2 << 16) + 10));
        assert_false(roaring64_bitmap_contains_range(r, 1, (2 << 16) + 11));
        roaring64_bitmap_free(r);
    }
    {
        // Container missing from range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (1 << 16) - 1);
        roaring64_bitmap_add_range(r, (2 << 16), (3 << 16) - 1);
        assert_false(roaring64_bitmap_contains_range(r, 1, (3 << 16) - 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range larger than bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 1 << 16);
        assert_false(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range entirely before the bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, 1 << 16);
        assert_false(roaring64_bitmap_contains_range(r, 1, 10));
        roaring64_bitmap_free(r);
    }
    {
        // Range entirely after the bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, 1 << 16);
        assert_false(
            roaring64_bitmap_contains_range(r, 2 << 16, (2 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range exactly containing the last value in a container range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, (1 << 16) - 1);
        assert_true(
            roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16)));
        assert_false(
            roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range exactly containing the first value in a container range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, (1 << 16));
        assert_true(
            roaring64_bitmap_contains_range(r, (1 << 16), (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10));
        roaring64_bitmap_add_range(r, UINT64_MAX - 0x10000 - 10,
                                   UINT64_MAX - 0x10000 + 10);
        assert_true(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10));
        assert_false(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX));
        roaring64_bitmap_free(r);
    }
    {
        // Range fully inside max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_add(r, UINT64_MAX - 1);
        assert_false(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_add(r, UINT64_MAX - 2);
        // contains_range is exclusive, so UINT64_MAX is not required
        assert_true(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_free(r);
    }
}